

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile.cpp
# Opt level: O3

bool __thiscall FlatFileSeq::Flush(FlatFileSeq *this,FlatFilePos *pos,bool finalize)

{
  bool bVar1;
  FILE *__stream;
  int *unaff_RBX;
  int source_line;
  char *flag;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  int iVar2;
  uint uVar3;
  char (*args) [6];
  
  args = *(char (**) [6])(in_FS_OFFSET + 0x28);
  iVar2 = pos->nFile;
  uVar3 = 0;
  __stream = (FILE *)Open(this,(FlatFilePos *)&stack0xffffffffffffffd0,false);
  if (__stream == (FILE *)0x0) {
    flag = "%s: failed to open file %d\n";
    source_line = 0x55;
  }
  else {
    if (finalize) {
      bVar1 = TruncateFile((FILE *)__stream,pos->nPos);
      if (!bVar1) {
        fclose(__stream);
        flag = "%s: failed to truncate file %d\n";
        source_line = 0x5a;
        goto LAB_004675bf;
      }
    }
    bVar1 = FileCommit((FILE *)__stream);
    if (bVar1) {
      DirectoryCommit(&this->m_dir);
      fclose(__stream);
      bVar1 = true;
      goto LAB_004675c6;
    }
    fclose(__stream);
    flag = "%s: failed to commit file %d\n";
    source_line = 0x5f;
  }
LAB_004675bf:
  logging_function._M_str = "Flush";
  logging_function._M_len = 5;
  source_file._M_str =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/flatfile.cpp";
  source_file._M_len = 0x55;
  LogPrintf_<char[6],int>
            (logging_function,source_file,source_line,(LogFlags)flag,(Level)pos,
             (char *)CONCAT44(uVar3,iVar2),args,unaff_RBX);
  bVar1 = false;
LAB_004675c6:
  if (*(char (**) [6])(in_FS_OFFSET + 0x28) == args) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool FlatFileSeq::Flush(const FlatFilePos& pos, bool finalize) const
{
    FILE* file = Open(FlatFilePos(pos.nFile, 0)); // Avoid fseek to nPos
    if (!file) {
        LogError("%s: failed to open file %d\n", __func__, pos.nFile);
        return false;
    }
    if (finalize && !TruncateFile(file, pos.nPos)) {
        fclose(file);
        LogError("%s: failed to truncate file %d\n", __func__, pos.nFile);
        return false;
    }
    if (!FileCommit(file)) {
        fclose(file);
        LogError("%s: failed to commit file %d\n", __func__, pos.nFile);
        return false;
    }
    DirectoryCommit(m_dir);

    fclose(file);
    return true;
}